

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_insert.cpp
# Opt level: O1

void duckdb::StructInsertFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  char cVar1;
  reference pvVar2;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true> *this;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_00;
  reference pvVar3;
  reference this_01;
  pointer pVVar4;
  size_type __n;
  size_type __n_00;
  
  pvVar2 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
  duckdb::Vector::Verify((ulong)pvVar2);
  this = (vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
          *)duckdb::StructVector::GetEntries(pvVar2);
  this_00 = (vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
             *)duckdb::StructVector::GetEntries(result);
  if (*(long *)(this + 8) != *(long *)this) {
    __n = 0;
    do {
      pvVar3 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
               ::operator[](this,__n);
      this_01 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                ::operator[](this_00,__n);
      pVVar4 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                         (this_01);
      unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(pvVar3);
      duckdb::Vector::Reference(pVVar4);
      __n = __n + 1;
    } while (__n < (ulong)(*(long *)(this + 8) - *(long *)this >> 3));
  }
  if (1 < (ulong)((*(long *)(args + 8) - *(long *)args >> 3) * 0x4ec4ec4ec4ec4ec5)) {
    __n_00 = 1;
    do {
      pvVar3 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
               ::operator[](this_00,((*(long *)(this + 8) - *(long *)this >> 3) + __n_00) - 1);
      pVVar4 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                         (pvVar3);
      vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,__n_00);
      duckdb::Vector::Reference(pVVar4);
      __n_00 = __n_00 + 1;
    } while (__n_00 < (ulong)((*(long *)(args + 8) - *(long *)args >> 3) * 0x4ec4ec4ec4ec4ec5));
  }
  duckdb::Vector::Verify((ulong)result);
  cVar1 = duckdb::DataChunk::AllConstant();
  if (cVar1 != '\0') {
    duckdb::Vector::SetVectorType((VectorType)result);
    return;
  }
  return;
}

Assistant:

static void StructInsertFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &starting_vec = args.data[0];
	starting_vec.Verify(args.size());

	auto &starting_child_entries = StructVector::GetEntries(starting_vec);
	auto &result_child_entries = StructVector::GetEntries(result);

	// Assign the original child entries to the STRUCT.
	for (idx_t i = 0; i < starting_child_entries.size(); i++) {
		auto &starting_child = starting_child_entries[i];
		result_child_entries[i]->Reference(*starting_child);
	}

	// Assign the new children to the result vector.
	for (idx_t i = 1; i < args.ColumnCount(); i++) {
		result_child_entries[starting_child_entries.size() + i - 1]->Reference(args.data[i]);
	}

	result.Verify(args.size());
	if (args.AllConstant()) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}